

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamCleaner.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *pcVar1;
  size_t sVar2;
  allocator local_5a;
  allocator local_59;
  string local_58;
  string local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Starting ",9);
  pcVar1 = argv[1];
  if (pcVar1 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1060e8);
  }
  else {
    sVar2 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar1,sVar2);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
  std::ostream::put(-0x18);
  std::ostream::flush();
  std::__cxx11::string::string((string *)&local_38,argv[1],&local_59);
  std::__cxx11::string::string((string *)&local_58,argv[2],&local_5a);
  clipCoverage(&local_38,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Ended",5);
  pcVar1 = argv[1];
  if (pcVar1 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1060e8);
  }
  else {
    sVar2 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar1,sVar2);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
  std::ostream::put(-0x18);
  std::ostream::flush();
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
    cout << "Starting "<< argv[1] << endl;
    clipCoverage(argv[1],argv[2]);
    cout << "Ended"<< argv[1] << endl;


}